

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O2

ly_bool json_print_array_is_last_inst(jsonpr_ctx *pctx,lyd_node *node)

{
  int iVar1;
  bool bVar2;
  
  iVar1 = is_open_array(pctx,node);
  if (iVar1 == 0) {
    bVar2 = false;
  }
  else if ((pctx->root != node) || (bVar2 = true, (pctx->options & 1) != 0)) {
    if (node->next == (lyd_node *)0x0) {
      bVar2 = true;
    }
    else {
      bVar2 = node->next->schema != node->schema;
    }
  }
  return bVar2;
}

Assistant:

static ly_bool
json_print_array_is_last_inst(struct jsonpr_ctx *pctx, const struct lyd_node *node)
{
    if (!is_open_array(pctx, node)) {
        /* no array open */
        return 0;
    }

    if ((pctx->root == node) && !(pctx->options & LYD_PRINT_WITHSIBLINGS)) {
        /* the only printed instance */
        return 1;
    }

    if (!node->next || (node->next->schema != node->schema)) {
        /* last instance */
        return 1;
    }

    return 0;
}